

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented::addAssertsInNonInstrumented(wasm::
Function*)::Walker::handleCall(wasm::Expression__(void *this,Expression *call)

{
  Builder *this_00;
  Type type;
  Index index;
  GlobalGet *left;
  LocalGet *right;
  Binary *condition;
  Expression *ifTrue;
  If *right_00;
  Block *replacement;
  ulong uVar1;
  ulong extraout_RDX;
  ulong in_R8;
  Name name;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  LocalSet *local_60;
  If *local_58;
  LocalGet *local_50;
  initializer_list<wasm::Expression_*> local_48;
  Builder *local_38;
  
  this_00 = *(Builder **)((long)this + 0xe0);
  name.super_IString.str._M_str = DAT_011756f8;
  name.super_IString.str._M_len = ASYNCIFY_STATE;
  left = Builder::makeGlobalGet(this_00,name,(Type)0x2);
  right = Builder::makeLocalGet
                    (*(Builder **)((long)this + 0xe0),*(Index *)((long)this + 0xe8),(Type)0x2);
  condition = Builder::makeBinary(this_00,NeInt32,(Expression *)left,(Expression *)right);
  ifTrue = (Expression *)Builder::makeUnreachable(*(Builder **)((long)this + 0xe0));
  uVar1 = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
  right_00 = Builder::makeIf(this_00,(Expression *)condition,ifTrue,(Expression *)0x0,type_01);
  type.id = (call->type).id;
  if (type.id < 2) {
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar1;
    replacement = Builder::makeSequence
                            (*(Builder **)((long)this + 0xe0),call,(Expression *)right_00,type_02);
  }
  else {
    index = Builder::addVar(*(Function **)((long)this + 0xd8),type);
    local_38 = *(Builder **)((long)this + 0xe0);
    local_60 = Builder::makeLocalSet(local_38,index,call);
    local_58 = right_00;
    local_50 = Builder::makeLocalGet(*(Builder **)((long)this + 0xe0),index,(Type)(call->type).id);
    local_48._M_len = 3;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_48._M_array = (iterator)&local_60;
    replacement = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                            (local_38,&local_48,type_00);
  }
  if (*(Function **)((long)this + 200) != (Function *)0x0) {
    debuginfo::copyOriginalToReplacement
              ((Expression *)**this,(Expression *)replacement,*(Function **)((long)this + 200));
  }
  **this = replacement;
  return;
}

Assistant:

void handleCall(Expression* call) {
        auto* check = builder->makeIf(
          builder->makeBinary(NeInt32,
                              builder->makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                              builder->makeLocalGet(oldState, Type::i32)),
          builder->makeUnreachable());
        Expression* rep;
        if (call->type.isConcrete()) {
          auto temp = builder->addVar(func, call->type);
          rep = builder->makeBlock({
            builder->makeLocalSet(temp, call),
            check,
            builder->makeLocalGet(temp, call->type),
          });
        } else {
          rep = builder->makeSequence(call, check);
        }
        replaceCurrent(rep);
      }